

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,StringPiece name)

{
  StringPiece name_00;
  bool bVar1;
  Type TVar2;
  pointer this_00;
  StringPiece local_98;
  Symbol local_88;
  Symbol symbol;
  string local_70 [32];
  long local_50;
  size_type dot_pos;
  string prefix;
  DescriptorPool *this_local;
  StringPiece name_local;
  
  name_local.ptr_ = (char *)name.length_;
  this_local = (DescriptorPool *)name.ptr_;
  prefix.field_2._8_8_ = this;
  stringpiece_internal::StringPiece::operator_cast_to_string
            ((string *)&dot_pos,(StringPiece *)&this_local);
  do {
    local_50 = std::__cxx11::string::find_last_of((char)&dot_pos,0x2e);
    if (local_50 == -1) {
      if (this->underlay_ == (DescriptorPool *)0x0) {
        name_local.length_._7_1_ = false;
      }
      else {
        name_00.length_ = (size_type)name_local.ptr_;
        name_00.ptr_ = (char *)this_local;
        name_local.length_._7_1_ = IsSubSymbolOfBuiltType(this->underlay_,name_00);
      }
      goto LAB_0064ba7b;
    }
    std::__cxx11::string::substr((ulong)local_70,(ulong)&dot_pos);
    std::__cxx11::string::operator=((string *)&dot_pos,local_70);
    std::__cxx11::string::~string(local_70);
    this_00 = std::
              unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              ::operator->(&this->tables_);
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dot_pos);
    local_88 = Tables::FindSymbol(this_00,local_98);
    bVar1 = Symbol::IsNull(&local_88);
  } while ((bVar1) || (TVar2 = Symbol::type(&local_88), TVar2 == PACKAGE));
  name_local.length_._7_1_ = true;
LAB_0064ba7b:
  std::__cxx11::string::~string((string *)&dot_pos);
  return (bool)(name_local.length_._7_1_ & 1);
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(StringPiece name) const {
  auto prefix = std::string(name);
  for (;;) {
    std::string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == std::string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type() != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}